

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.c
# Opt level: O0

stumpless_entry * stumpless_set_entry_message_str(stumpless_entry *entry,char *message)

{
  void *mem;
  char *old_message;
  size_t new_message_length;
  char *new_message;
  char *message_local;
  stumpless_entry *entry_local;
  
  new_message = message;
  message_local = (char *)entry;
  if (entry == (stumpless_entry *)0x0) {
    raise_argument_empty("entry was NULL");
    entry_local = (stumpless_entry *)0x0;
  }
  else {
    if (message == (char *)0x0) {
      new_message_length = 0;
      old_message = (char *)0x0;
    }
    else {
      new_message_length = (size_t)copy_cstring_with_length(message,(size_t *)&old_message);
      if ((char *)new_message_length == (char *)0x0) {
        return (stumpless_entry *)0x0;
      }
    }
    lock_entry((stumpless_entry *)message_local);
    mem = *(void **)(message_local + 0x1e0);
    *(size_t *)(message_local + 0x1e0) = new_message_length;
    *(char **)(message_local + 0x1e8) = old_message;
    unlock_entry((stumpless_entry *)message_local);
    free_mem(mem);
    clear_error();
    entry_local = (stumpless_entry *)message_local;
  }
  return entry_local;
}

Assistant:

struct stumpless_entry *
stumpless_set_entry_message_str( struct stumpless_entry *entry,
                                 const char *message ) {
  char *new_message;
  size_t new_message_length;
  const char *old_message;

  VALIDATE_ARG_NOT_NULL( entry );

  if( message ) {
    new_message = copy_cstring_with_length( message, &new_message_length );
    if( !new_message ) {
      return NULL;
    }
  } else {
    new_message = NULL;
    new_message_length = 0;
  }

  lock_entry( entry );
  old_message = entry->message;
  entry->message = new_message;
  entry->message_length = new_message_length;
  unlock_entry( entry );

  free_mem( old_message );
  clear_error(  );

  return entry;
}